

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O2

ArticulatedBodyInertia *
iDynTree::ArticulatedBodyInertia::ABADyadHelperLin
          (ArticulatedBodyInertia *__return_storage_ptr__,SpatialForceVector *U,double inv_d,
          SpatialForceVector *param_3,double d_inv_d)

{
  SpatialVector<iDynTree::SpatialForceVector> *pSVar1;
  AngularVector3T *pAVar2;
  ArticulatedBodyInertia *local_1f0 [2];
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
  local_1e0 [16];
  double local_1d0;
  SpatialVector<iDynTree::SpatialForceVector> *local_1c8;
  SpatialVector<iDynTree::SpatialForceVector> *local_1b0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  local_1a0 [24];
  double local_188;
  SpatialVector<iDynTree::SpatialForceVector> *local_180;
  SpatialVector<iDynTree::SpatialForceVector> *local_168;
  double local_148;
  SpatialVector<iDynTree::SpatialForceVector> *local_140;
  SpatialVector<iDynTree::SpatialForceVector> *local_128;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>_>
  local_110;
  
  ArticulatedBodyInertia(__return_storage_ptr__);
  pSVar1 = &U->super_SpatialVector<iDynTree::SpatialForceVector>;
  pAVar2 = &(U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3;
  local_1d0 = inv_d;
  local_1c8 = pSVar1;
  local_1b0 = pSVar1;
  local_188 = d_inv_d;
  local_180 = pSVar1;
  local_168 = pSVar1;
  local_148 = inv_d;
  local_140 = pSVar1;
  local_128 = pSVar1;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  ::operator+(&local_110,local_1a0,local_1e0);
  local_1f0[0] = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_1f0,
             &local_110);
  local_1d0 = inv_d;
  local_1c8 = pSVar1;
  local_1b0 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_188 = d_inv_d;
  local_180 = pSVar1;
  local_168 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_148 = inv_d;
  local_140 = pSVar1;
  local_128 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  ::operator+(&local_110,local_1a0,local_1e0);
  local_1f0[0] = (ArticulatedBodyInertia *)&__return_storage_ptr__->linearAngular;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_1f0,
             &local_110);
  local_1d0 = inv_d;
  local_1c8 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_1b0 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_188 = d_inv_d;
  local_180 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_168 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_148 = inv_d;
  local_140 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  local_128 = (SpatialVector<iDynTree::SpatialForceVector> *)pAVar2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
  ::operator+(&local_110,local_1a0,local_1e0);
  local_1f0[0] = (ArticulatedBodyInertia *)&__return_storage_ptr__->angularAngular;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>const>>
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_1f0,
             &local_110);
  return __return_storage_ptr__;
}

Assistant:

ArticulatedBodyInertia ArticulatedBodyInertia::ABADyadHelperLin(const SpatialForceVector& U, const double inv_d,
                                                                const SpatialForceVector& /*dU*/, const double d_inv_d)
{
    ArticulatedBodyInertia ret;

    Eigen::Map<const Eigen::Vector3d> Ulin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> Uang(U.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> dUlin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> dUang(U.getAngularVec3().data());

    toEigen(ret.getLinearLinearSubmatrix()) =   (d_inv_d*Ulin)*Ulin.transpose()
                                              + (inv_d*dUlin)*Ulin.transpose()
                                              + (inv_d*Ulin)*dUlin.transpose();
    toEigen(ret.getLinearAngularSubmatrix()) =  (d_inv_d*Ulin)*Uang.transpose()
                                              + (inv_d*dUlin)*Uang.transpose()
                                              + (inv_d*Ulin)*dUang.transpose();
    toEigen(ret.getAngularAngularSubmatrix()) = (d_inv_d*Uang)*Uang.transpose()
                                              + (inv_d*dUang)*Uang.transpose()
                                              + (inv_d*Uang)*dUang.transpose();

    return ret;
}